

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenMetadataTest_ExcessDataProof_Test>::
CreateTest(ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenMetadataTest_ExcessDataProof_Test>
           *this)

{
  Test *this_00;
  ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenMetadataTest_ExcessDataProof_Test>
  *this_local;
  
  WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>::SetParam
            (&this->parameter_);
  this_00 = (Test *)operator_new(0x58);
  bssl::anon_unknown_0::TrustTokenMetadataTest_ExcessDataProof_Test::
  TrustTokenMetadataTest_ExcessDataProof_Test
            ((TrustTokenMetadataTest_ExcessDataProof_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }